

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delay.cpp
# Opt level: O2

void DeleteDelayTest::startTest(vector<int,_std::allocator<int>_> *keys)

{
  uint uVar1;
  int iVar2;
  uint *puVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  ostream *poVar7;
  uint *puVar8;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  allocator_type local_b1;
  vector<double,_std::allocator<double>_> throughput;
  vector<double,_std::allocator<double>_> avgTime;
  vector<int,_std::allocator<int>_> count;
  vector<int,_std::allocator<int>_> time;
  
  std::random_shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             (keys->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      (keys->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish);
  std::vector<int,_std::allocator<int>_>::vector(&time,100,(allocator_type *)&avgTime);
  std::vector<double,_std::allocator<double>_>::vector(&avgTime,100,(allocator_type *)&throughput);
  std::vector<double,_std::allocator<double>_>::vector(&throughput,100,(allocator_type *)&count);
  std::vector<int,_std::allocator<int>_>::vector(&count,100,&local_b1);
  puVar3 = (uint *)(keys->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
  lVar9 = 0;
  for (puVar8 = (uint *)(keys->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start; puVar8 != puVar3; puVar8 = puVar8 + 1) {
    uVar1 = *puVar8;
    lVar5 = std::chrono::_V2::system_clock::now();
    KVStore::del(&store,(long)(int)uVar1);
    lVar6 = std::chrono::_V2::system_clock::now();
    lVar5 = (lVar6 - lVar5) / 1000;
    iVar4 = (int)lVar5;
    if ((int)uVar1 < 0x40000) {
      *count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
           = *count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start + 1;
      *time.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
           *time.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start + iVar4;
    }
    else if (uVar1 < 0x80000) {
      count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [1] = count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[1] + 1;
      time.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[1]
           = time.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[1] + iVar4;
    }
    else if (uVar1 < 0x100000) {
      count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [2] = count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[2] + 1;
      time.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[2]
           = time.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[2] + iVar4;
    }
    else if (uVar1 < 0x180000) {
      count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [3] = count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[3] + 1;
      time.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[3]
           = time.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[3] + iVar4;
    }
    else {
      count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [4] = count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[4] + 1;
      time.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[4]
           = time.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[4] + iVar4;
    }
    lVar9 = lVar9 + lVar5;
  }
  for (lVar5 = 0; lVar5 != 5; lVar5 = lVar5 + 1) {
    iVar4 = time.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar5];
    iVar2 = count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar5];
    avgTime.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar5] = (double)iVar4 / (double)iVar2;
    throughput.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar5] = (1.0 / ((double)iVar4 / (double)iVar2)) * 1000.0 * 1000.0;
  }
  poVar7 = std::operator<<((ostream *)&std::cout,">>>>> Delete Test <<<<<");
  std::endl<char,std::char_traits<char>>(poVar7);
  poVar7 = std::operator<<((ostream *)&std::cout,
                           "Average Delay And Throughput For Different Size Data: ");
  std::endl<char,std::char_traits<char>>(poVar7);
  lVar5 = std::cout;
  *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)(operator_delete__ + *(long *)(lVar5 + -0x18)) = 2;
  std::operator<<((ostream *)&std::cout,"0 ~ 0.25MB     : ");
  poVar7 = std::ostream::_M_insert<double>
                     (*avgTime.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start);
  poVar7 = std::operator<<(poVar7,anon_var_dwarf_309e8);
  std::operator<<(poVar7,"throughput: ");
  poVar7 = std::ostream::_M_insert<double>
                     (*throughput.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start);
  poVar7 = std::operator<<(poVar7,"/s");
  std::endl<char,std::char_traits<char>>(poVar7);
  std::operator<<((ostream *)&std::cout,"0.25MB ~ 0.5MB : ");
  poVar7 = std::ostream::_M_insert<double>
                     (avgTime.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[1]);
  poVar7 = std::operator<<(poVar7,anon_var_dwarf_309e8);
  std::operator<<(poVar7,"throughput: ");
  poVar7 = std::ostream::_M_insert<double>
                     (throughput.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[1]);
  poVar7 = std::operator<<(poVar7,"/s");
  std::endl<char,std::char_traits<char>>(poVar7);
  std::operator<<((ostream *)&std::cout,"0.5MB ~ 1MB    : ");
  poVar7 = std::ostream::_M_insert<double>
                     (avgTime.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[2]);
  poVar7 = std::operator<<(poVar7,anon_var_dwarf_309e8);
  std::operator<<(poVar7,"throughput: ");
  poVar7 = std::ostream::_M_insert<double>
                     (throughput.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[2]);
  poVar7 = std::operator<<(poVar7,"/s");
  std::endl<char,std::char_traits<char>>(poVar7);
  std::operator<<((ostream *)&std::cout,"1MB ~ 1.5MB    : ");
  poVar7 = std::ostream::_M_insert<double>
                     (avgTime.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[3]);
  poVar7 = std::operator<<(poVar7,anon_var_dwarf_309e8);
  std::operator<<(poVar7,"throughput: ");
  poVar7 = std::ostream::_M_insert<double>
                     (throughput.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[3]);
  poVar7 = std::operator<<(poVar7,"/s");
  std::endl<char,std::char_traits<char>>(poVar7);
  std::operator<<((ostream *)&std::cout,"1.5MB ~ 2MB    : ");
  poVar7 = std::ostream::_M_insert<double>
                     (avgTime.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[4]);
  poVar7 = std::operator<<(poVar7,anon_var_dwarf_309e8);
  std::operator<<(poVar7,"throughput: ");
  poVar7 = std::ostream::_M_insert<double>
                     (throughput.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[4]);
  poVar7 = std::operator<<(poVar7,"/s");
  std::endl<char,std::char_traits<char>>(poVar7);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::operator<<((ostream *)&std::cout,"Average Delay: ");
  auVar10._8_4_ = (int)((ulong)lVar9 >> 0x20);
  auVar10._0_8_ = lVar9;
  auVar10._12_4_ = 0x45300000;
  dVar13 = (auVar10._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0);
  lVar9 = (long)(keys->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(keys->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
  lVar5 = lVar9 >> 2;
  auVar11._8_4_ = (int)(lVar9 >> 0x22);
  auVar11._0_8_ = lVar5;
  auVar11._12_4_ = 0x45300000;
  poVar7 = std::ostream::_M_insert<double>
                     (dVar13 / ((auVar11._8_8_ - 1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)));
  poVar7 = std::operator<<(poVar7,anon_var_dwarf_309f3);
  std::operator<<(poVar7,"Average Throughput: ");
  lVar9 = (long)(keys->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(keys->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
  lVar5 = lVar9 >> 2;
  auVar12._8_4_ = (int)(lVar9 >> 0x22);
  auVar12._0_8_ = lVar5;
  auVar12._12_4_ = 0x45300000;
  poVar7 = std::ostream::_M_insert<double>
                     ((1.0 / (dVar13 / ((auVar12._8_8_ - 1.9342813113834067e+25) +
                                       ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0
                                       )))) * 1000.0 * 1000.0);
  poVar7 = std::operator<<(poVar7,"/s");
  std::endl<char,std::char_traits<char>>(poVar7);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&count.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&throughput.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&avgTime.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&time.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

static void startTest(vector<int> &keys) {
    random_shuffle(keys.begin(), keys.end());

    vector<int> time(100);
    vector<double> avgTime(100);
    vector<double> throughput(100);
    vector<int> count(100);

    unsigned long long totalTime = 0;

    for (auto key : keys) {
      auto start = high_resolution_clock::now();
      store.del(key);
      auto end = high_resolution_clock::now();
      auto ms = duration_cast<microseconds>(end - start).count();

      if (key < 256 * 1024) {
        count[0]++;
        time[0] += ms;
      } else if (key < 512 * 1024) {
        count[1]++;
        time[1] += ms;
      } else if (key < 1024 * 1024) {
        count[2]++;
        time[2] += ms;
      } else if (key < 1536 * 1024) {
        count[3]++;
        time[3] += ms;
      } else {
        count[4]++;
        time[4] += ms;
      }

      totalTime += ms;
    }

    for (int i = 0; i < 5; i++) {
      avgTime[i] = time[i] / (double)count[i];
      throughput[i] = 1 / avgTime[i] * 1000 * 1000;
    }

    cout << ">>>>> Delete Test <<<<<" << endl;
    cout << "Average Delay And Throughput For Different Size Data: " << endl;
    cout << fixed << setprecision(2);
    cout << "0 ~ 0.25MB     : " << avgTime[0] << "µs "
         << "throughput: " << throughput[0] << "/s" << endl;
    cout << "0.25MB ~ 0.5MB : " << avgTime[1] << "µs "
         << "throughput: " << throughput[1] << "/s" << endl;
    cout << "0.5MB ~ 1MB    : " << avgTime[2] << "µs "
         << "throughput: " << throughput[2] << "/s" << endl;
    cout << "1MB ~ 1.5MB    : " << avgTime[3] << "µs "
         << "throughput: " << throughput[3] << "/s" << endl;
    cout << "1.5MB ~ 2MB    : " << avgTime[4] << "µs "
         << "throughput: " << throughput[4] << "/s" << endl;
    cout << endl;
    cout << "Average Delay: " << totalTime / (double)keys.size() << "µs, "
         << "Average Throughput: "
         << 1 / (totalTime / (double)keys.size()) * 1000 * 1000 << "/s" << endl;
    cout << endl;
  }